

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferedRegionProfile.cpp
# Opt level: O0

double __thiscall cali::BufferedRegionProfile::region_time(BufferedRegionProfile *this,char *region)

{
  iterator __s;
  bool bVar1;
  element_type *peVar2;
  pointer ppVar3;
  double local_90;
  _Self local_60 [3];
  allocator<char> local_41;
  key_type local_40;
  _Self local_20;
  iterator it;
  char *region_local;
  BufferedRegionProfile *this_local;
  
  it._M_node = (_Base_ptr)region;
  peVar2 = std::
           __shared_ptr_access<cali::BufferedRegionProfile::BufferedRegionProfileImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cali::BufferedRegionProfile::BufferedRegionProfileImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mP);
  __s._M_node = it._M_node;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,(char *)__s._M_node,&local_41);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
       ::find(&peVar2->reg_times,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  peVar2 = std::
           __shared_ptr_access<cali::BufferedRegionProfile::BufferedRegionProfileImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cali::BufferedRegionProfile::BufferedRegionProfileImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mP);
  local_60[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
       ::end(&peVar2->reg_times);
  bVar1 = std::operator==(&local_20,local_60);
  if (bVar1) {
    local_90 = 0.0;
  }
  else {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
             ::operator->(&local_20);
    local_90 = ppVar3->second;
  }
  return local_90;
}

Assistant:

double BufferedRegionProfile::region_time(const char* region) const
{
    auto it = mP->reg_times.find(region);
    return (it == (mP->reg_times).end() ? 0.0 : it->second);
}